

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O3

bool deqp::gles3::Functional::anon_unknown_0::compareColoredPixels(IVec4 *a,IVec4 *b)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar5 [16];
  uint uVar9;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar10 [16];
  Vector<bool,_4> res;
  
  if (a->m_data[1] == 0 && a->m_data[0] == 0) {
    bVar3 = a->m_data[2] == 0;
  }
  else {
    bVar3 = false;
  }
  if (b->m_data[1] == 0 && b->m_data[0] == 0) {
    if ((bVar3 & b->m_data[2] == 0) != 0) {
      return true;
    }
    if (bVar3 != (b->m_data[2] == 0)) {
      return false;
    }
  }
  else if (bVar3 != false) {
    return false;
  }
  uVar4 = a->m_data[0] - b->m_data[0];
  uVar6 = a->m_data[1] - b->m_data[1];
  uVar7 = a->m_data[2] - b->m_data[2];
  uVar8 = a->m_data[3] - b->m_data[3];
  uVar9 = (int)uVar4 >> 0x1f;
  uVar11 = (int)uVar6 >> 0x1f;
  uVar12 = (int)uVar7 >> 0x1f;
  uVar13 = (int)uVar8 >> 0x1f;
  auVar5._0_4_ = -(uint)(0x14 < (int)((uVar4 ^ uVar9) - uVar9));
  auVar5._4_4_ = -(uint)(0x14 < (int)((uVar6 ^ uVar11) - uVar11));
  auVar5._8_4_ = -(uint)(0x14 < (int)((uVar7 ^ uVar12) - uVar12));
  auVar5._12_4_ = -(uint)(0 < (int)((uVar8 ^ uVar13) - uVar13));
  auVar5 = packssdw(auVar5,auVar5);
  auVar10._8_4_ = 0xffffffff;
  auVar10._0_8_ = 0xffffffffffffffff;
  auVar10._12_4_ = 0xffffffff;
  auVar5 = packsswb(auVar10 ^ auVar5,auVar10 ^ auVar5);
  if ((byte)(auVar5[0] & DAT_01b89df0) == 0) {
    return false;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 3) break;
    uVar1 = uVar2 + 1;
  } while (res.m_data[uVar2 + 1] != false);
  return 2 < uVar2;
}

Assistant:

inline bool compareColoredPixels (const tcu::IVec4& a, const tcu::IVec4& b)
{
	const bool aIsBlack = isBlack(a);
	const bool bIsBlack = isBlack(b);
	const tcu::IVec4 threshold(20, 20, 20, 0);

	if (aIsBlack && bIsBlack)
		return true;
	if (aIsBlack != bIsBlack)
		return false;

	return tcu::boolAll(tcu::lessThanEqual(tcu::abs(a - b), threshold));
}